

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_validator.cpp
# Opt level: O2

void __thiscall duckdb::ThreadLines::Verify(ThreadLines *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  NotImplementedException *this_00;
  _Base_ptr p_Var5;
  bool bVar6;
  string local_1b0;
  ostringstream error;
  
  p_Var3 = (this->thread_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = (_Base_ptr)0x0;
  bVar6 = false;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(this->thread_lines)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    if (bVar6) {
      p_Var1 = p_Var3[1]._M_parent;
      p_Var2 = p_Var1;
      if ((p_Var1 != p_Var3[1]._M_left) &&
         (((_Base_ptr)((long)&p_Var5->_M_color + 2U) < p_Var1 ||
          (p_Var2 = p_Var3[1]._M_left, p_Var1 < (_Base_ptr)((long)&p_Var5[-1]._M_right + 6))))) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
        poVar4 = ::std::operator<<((ostream *)&error,
                                   "The Parallel CSV Reader currently does not support a full read on this file."
                                  );
        ::std::operator<<(poVar4,'\n');
        poVar4 = ::std::operator<<((ostream *)&error,
                                   "To correctly parse this file, please run with the single threaded error (i.e., parallel = false)"
                                  );
        ::std::operator<<(poVar4,'\n');
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::stringbuf::str();
        NotImplementedException::NotImplementedException(this_00,&local_1b0);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
    }
    else {
      p_Var2 = p_Var3[1]._M_left;
    }
    p_Var5 = p_Var2;
    p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3);
    bVar6 = true;
  } while( true );
}

Assistant:

void ThreadLines::Verify() const {
	bool initialized = false;
	idx_t last_end_pos = 0;
	for (auto &line_info : thread_lines) {
		if (!initialized) {
			// First run, we just set the initialized to true
			initialized = true;
		} else {
			if (line_info.second.start_pos == line_info.second.end_pos) {
				last_end_pos = line_info.second.end_pos;
				continue;
			}
			if (last_end_pos + error_margin < line_info.second.start_pos ||
			    line_info.second.start_pos < last_end_pos - error_margin) {
				std::ostringstream error;
				error << "The Parallel CSV Reader currently does not support a full read on this file." << '\n';
				error << "To correctly parse this file, please run with the single threaded error (i.e., parallel = "
				         "false)"
				      << '\n';
				throw NotImplementedException(error.str());
			}
		}
		last_end_pos = line_info.second.end_pos;
	}
}